

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall fasttext::Dictionary::getId(Dictionary *this,string_view w)

{
  int32_t iVar1;
  
  iVar1 = find(this,w);
  return (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[iVar1];
}

Assistant:

int32_t Dictionary::getId(const std::string_view w) const {
  int32_t h = find(w);
  return word2int_[h];
}